

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLUtils.h
# Opt level: O2

void COLLADASaxFWL::deleteVectorFW<COLLADAFW::Joint*>
               (vector<COLLADAFW::Joint_*,_std::allocator<COLLADAFW::Joint_*>_> *list)

{
  pointer ppJVar1;
  pointer ppJVar2;
  Joint *pJVar3;
  long lVar4;
  
  ppJVar1 = (list->super__Vector_base<COLLADAFW::Joint_*,_std::allocator<COLLADAFW::Joint_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  ppJVar2 = (list->super__Vector_base<COLLADAFW::Joint_*,_std::allocator<COLLADAFW::Joint_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = 0; (long)ppJVar1 - (long)ppJVar2 >> 3 != lVar4; lVar4 = lVar4 + 1) {
    pJVar3 = (list->super__Vector_base<COLLADAFW::Joint_*,_std::allocator<COLLADAFW::Joint_*>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar4];
    if (pJVar3 != (Joint *)0x0) {
      (*(pJVar3->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004>).super_Object.
        _vptr_Object[1])();
    }
  }
  return;
}

Assistant:

void deleteVectorFW( const std::vector<ListType>& list )
	{
		for ( size_t i = 0, count = list.size(); i < count; ++i)
		{
			ListType listItem = list[i];
			FW_DELETE listItem;
		}
	}